

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

void Cof_ManPrintHighFanout(Cof_Man_t *p,int nNodes)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Cof_Obj_t *pObj_00;
  undefined4 local_2c;
  int i;
  Cof_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int nNodes_local;
  Cof_Man_t *p_local;
  
  p_00 = Cof_ManCollectHighFanout(p,nNodes);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Cof_Obj_t *)Vec_PtrEntry(p_00,local_2c);
    Cof_ManPrintHighFanoutOne(p,pObj_00);
  }
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Cof_ManPrintHighFanout( Cof_Man_t * p, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Cof_Obj_t * pObj;
    int i;
    vNodes = Cof_ManCollectHighFanout( p, nNodes );
    Vec_PtrForEachEntry( Cof_Obj_t *, vNodes, pObj, i )
        Cof_ManPrintHighFanoutOne( p, pObj );
    Vec_PtrFree( vNodes );
}